

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_GetThisScoped
              (FrameDisplay *pScope,Var defaultInstance,ScriptContext *scriptContext)

{
  ushort uVar1;
  BOOL BVar2;
  void *aValue;
  RecyclableObject *instance;
  int i;
  uint index;
  Var local_38;
  Var value;
  
  uVar1 = pScope->length;
  index = 0;
  do {
    if (uVar1 == index) {
      return defaultInstance;
    }
    local_38 = (Var)0x0;
    aValue = FrameDisplay::GetItem(pScope,index);
    instance = VarTo<Js::RecyclableObject>(aValue);
    BVar2 = GetProperty(instance,0x2d5,&local_38,scriptContext,(PropertyValueInfo *)0x0);
    index = index + 1;
  } while (BVar2 == 0);
  return local_38;
}

Assistant:

Var JavascriptOperators::OP_GetThisScoped(FrameDisplay *pScope, Var defaultInstance, ScriptContext* scriptContext)
    {
        // NOTE: If changes are made to this logic be sure to update the debuggers as well
        int length = pScope->GetLength();

        for (int i = 0; i < length; i += 1)
        {
            Var value = nullptr;
            RecyclableObject *obj = VarTo<RecyclableObject>(pScope->GetItem(i));
            if (JavascriptOperators::GetProperty(obj, Js::PropertyIds::_this, &value, scriptContext))
            {
                return value;
            }
        }

        return defaultInstance;
    }